

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O2

void __thiscall liblogger::LogTcpServer::~LogTcpServer(LogTcpServer *this)

{
  list<int,_std::allocator<int>_> *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  ssize_t sVar3;
  char value;
  void *ret;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogTcpServer_00152948;
  if (this->m_running == true) {
    value = 'Q';
    sVar3 = write(this->m_ctlfd[1],&value,1);
    if (sVar3 != 1) goto LAB_001408cf;
    ret = (void *)0x0;
    iVar2 = pthread_join(this->m_thread,&ret);
    if (iVar2 != 0) goto LAB_001408cf;
    this->m_running = false;
  }
  this_00 = &this->m_list;
  while (p_Var1 = (this_00->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_00) {
    iVar2 = close(*(int *)&p_Var1[1]._M_next);
    if (iVar2 < 0) goto LAB_001408cf;
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front(this_00);
  }
  if (-1 < this->m_acceptfd) {
    iVar2 = close(this->m_acceptfd);
    if (iVar2 < 0) goto LAB_001408cf;
  }
  if (-1 < this->m_ctlfd[0]) {
    iVar2 = close(this->m_ctlfd[0]);
    if (iVar2 < 0) goto LAB_001408cf;
  }
  if (-1 < this->m_ctlfd[1]) {
    iVar2 = close(this->m_ctlfd[1]);
    if (iVar2 < 0) goto LAB_001408cf;
  }
  iVar2 = pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 == 0) {
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              (&this_00->super__List_base<int,_std::allocator<int>_>);
    return;
  }
LAB_001408cf:
  abort();
}

Assistant:

LogTcpServer::~LogTcpServer()
{
	if (m_running)
	{
		char value = 'Q';

		if (write(m_ctlfd[1], &value, sizeof(value)) != sizeof(value))
		{
			abort();
		}

		void *ret = NULL;
		if (pthread_join(m_thread, &ret) != 0)
		{
			abort();
		}
		m_running = false;
	}

	//No background thread. So no locking required from this point on

	while(!m_list.empty())
	{
		int fd = m_list.front();
		if (close(fd) < 0)
			abort();
		m_list.pop_front();
	}

	if (m_acceptfd >= 0)
	{
		if (close(m_acceptfd) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[0] >= 0)
	{
		if (close(m_ctlfd[0]) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[1] >= 0)
	{
		if (close(m_ctlfd[1]) < 0)
		{
			abort();
		}
	}

	if (pthread_mutex_destroy(&m_mutex) != 0)
		abort();

}